

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

string * __thiscall
t_cpp_generator::function_signature
          (string *__return_storage_ptr__,t_cpp_generator *this,t_function *tfunction,string *style,
          string *prefix,bool name_params)

{
  t_type *ttype;
  t_struct *tstruct;
  pointer pptVar1;
  pointer pptVar2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  char *__rhs;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string cob_type;
  string exn_cob;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  t_struct *local_d8;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ttype = tfunction->returntype_;
  tstruct = tfunction->arglist_;
  pptVar1 = (tfunction->xceptions_->members_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar2 = (tfunction->xceptions_->members_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar3 = std::operator==(style,"");
  if (bVar3) {
    bVar3 = is_complex_type(this,ttype);
    if (bVar3) {
      std::operator+(&local_f8,"void ",prefix);
      std::operator+(&local_118,&local_f8,&tfunction->name_);
      std::operator+(&local_1d8,&local_118,"(");
      type_name_abi_cxx11_(&local_138,this,ttype,false,false);
      std::operator+(&local_1b8,&local_1d8,&local_138);
      __rhs = "& /* _return */";
      if (name_params) {
        __rhs = "& _return";
      }
      std::operator+(&exn_cob,&local_1b8,__rhs);
      argument_list_abi_cxx11_(&local_d0,this,tstruct,name_params,true);
      std::operator+(&cob_type,&exn_cob,&local_d0);
      std::operator+(__return_storage_ptr__,&cob_type,")");
      std::__cxx11::string::~string((string *)&cob_type);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&exn_cob);
      std::__cxx11::string::~string((string *)&local_1b8);
      this_00 = &local_138;
    }
    else {
      type_name_abi_cxx11_(&local_f8,this,ttype,false,false);
      std::operator+(&local_118,&local_f8," ");
      std::operator+(&local_1d8,&local_118,prefix);
      std::operator+(&local_1b8,&local_1d8,&tfunction->name_);
      std::operator+(&exn_cob,&local_1b8,"(");
      argument_list_abi_cxx11_(&local_138,this,tstruct,name_params,false);
      std::operator+(&cob_type,&exn_cob,&local_138);
      std::operator+(__return_storage_ptr__,&cob_type,")");
      std::__cxx11::string::~string((string *)&cob_type);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&exn_cob);
      this_00 = &local_1b8;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_118);
    this_01 = &local_f8;
  }
  else {
    local_d8 = tstruct;
    std::__cxx11::string::substr((ulong)&cob_type,(ulong)style);
    bVar3 = std::operator==(&cob_type,"Cob");
    std::__cxx11::string::~string((string *)&cob_type);
    if (!bVar3) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = "UNKNOWN STYLE";
      __cxa_throw(puVar5,&char_const*::typeinfo,0);
    }
    cob_type._M_dataplus._M_p = (pointer)&cob_type.field_2;
    cob_type._M_string_length = 0;
    cob_type.field_2._M_local_buf[0] = '\0';
    exn_cob._M_dataplus._M_p = (pointer)&exn_cob.field_2;
    exn_cob._M_string_length = 0;
    exn_cob.field_2._M_local_buf[0] = '\0';
    bVar3 = std::operator==(style,"CobCl");
    if (bVar3) {
      std::operator+(&local_1d8,"(",&(this->super_t_oop_generator).super_t_generator.service_name_);
      std::operator+(&local_1b8,&local_1d8,"CobClient");
      std::__cxx11::string::operator=((string *)&cob_type,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      if (this->gen_templates_ == true) {
        std::__cxx11::string::append((char *)&cob_type);
      }
      std::__cxx11::string::append((char *)&cob_type);
    }
    else {
      bVar3 = std::operator==(style,"CobSv");
      if (!bVar3) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = "UNKNOWN STYLE";
        __cxa_throw(puVar5,&char_const*::typeinfo,0);
      }
      iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
      if ((char)iVar4 == '\0') {
        type_name_abi_cxx11_(&local_118,this,ttype,false,false);
        std::operator+(&local_1d8,"(",&local_118);
        std::operator+(&local_1b8,&local_1d8," const& _return)");
      }
      else {
        std::__cxx11::string::string((string *)&local_1b8,"()",(allocator *)&local_1d8);
      }
      std::__cxx11::string::operator=((string *)&cob_type,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      if ((char)iVar4 == '\0') {
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_118);
      }
      if (pptVar1 != pptVar2) {
        std::__cxx11::string::assign((char *)&exn_cob);
      }
    }
    std::operator+(&local_90,"void ",prefix);
    std::operator+(&local_70,&local_90,&tfunction->name_);
    std::operator+(&local_50,&local_70,"(::std::function<void");
    std::operator+(&local_d0,&local_50,&cob_type);
    std::operator+(&local_138,&local_d0,"> cob");
    std::operator+(&local_f8,&local_138,&exn_cob);
    argument_list_abi_cxx11_(&local_b0,this,local_d8,name_params,true);
    std::operator+(&local_1b8,&local_f8,&local_b0);
    std::operator+(__return_storage_ptr__,&local_1b8,")");
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&exn_cob);
    this_01 = &cob_type;
  }
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::function_signature(t_function* tfunction,
                                           string style,
                                           string prefix,
                                           bool name_params) {
  t_type* ttype = tfunction->get_returntype();
  t_struct* arglist = tfunction->get_arglist();
  bool has_xceptions = !tfunction->get_xceptions()->get_members().empty();

  if (style == "") {
    if (is_complex_type(ttype)) {
      return "void " + prefix + tfunction->get_name() + "(" + type_name(ttype)
             + (name_params ? "& _return" : "& /* _return */")
             + argument_list(arglist, name_params, true) + ")";
    } else {
      return type_name(ttype) + " " + prefix + tfunction->get_name() + "("
             + argument_list(arglist, name_params) + ")";
    }
  } else if (style.substr(0, 3) == "Cob") {
    string cob_type;
    string exn_cob;
    if (style == "CobCl") {
      cob_type = "(" + service_name_ + "CobClient";
      if (gen_templates_) {
        cob_type += "T<Protocol_>";
      }
      cob_type += "* client)";
    } else if (style == "CobSv") {
      cob_type = (ttype->is_void() ? "()" : ("(" + type_name(ttype) + " const& _return)"));
      if (has_xceptions) {
        exn_cob
            = ", ::std::function<void(::apache::thrift::TDelayedException* _throw)> /* exn_cob */";
      }
    } else {
      throw "UNKNOWN STYLE";
    }

    return "void " + prefix + tfunction->get_name() + "(::std::function<void" + cob_type + "> cob"
           + exn_cob + argument_list(arglist, name_params, true) + ")";
  } else {
    throw "UNKNOWN STYLE";
  }
}